

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O2

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/array_object.cpp:645:59)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_array_object_cpp:645:59)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  bool bVar1;
  uint32_t uVar2;
  long *plVar3;
  undefined8 *puVar4;
  long lVar5;
  object *poVar6;
  long lVar7;
  long extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  pointer pvVar8;
  ulong uVar9;
  _Alloc_hider this_00;
  double dVar10;
  double local_e0;
  wstring_view local_d8;
  object_ptr o;
  wstring is;
  value search_element;
  size_type local_68;
  pointer local_60;
  wstring_view local_58;
  
  plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this->f);
  (**(code **)(*plVar3 + 0x88))(&o.super_gc_heap_ptr_untyped,plVar3,this_);
  puVar4 = (undefined8 *)gc_heap_ptr_untyped::get(&o.super_gc_heap_ptr_untyped);
  local_58._M_str = L"length";
  local_58._M_len = 6;
  (**(code **)*puVar4)(&search_element,puVar4);
  uVar2 = to_uint32(&search_element);
  value::~value(&search_element);
  if (uVar2 == 0) {
    local_e0 = -1.0;
    goto LAB_0012aa6c;
  }
  pvVar8 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
      super__Vector_impl_data._M_finish == pvVar8) {
    pvVar8 = (pointer)&value::undefined;
  }
  value::value(&search_element,pvVar8);
  if ((search_element.type_ == number) &&
     (dVar10 = value::number_value(&search_element), NAN(dVar10))) {
LAB_0012aa54:
    local_e0 = -1.0;
  }
  else {
    pvVar8 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = (long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pvVar8;
    lVar7 = lVar5 % 0x28;
    dVar10 = 0.0;
    if ((ulong)(lVar5 / 0x28) < 2) {
LAB_0012a89c:
      uVar9 = (ulong)dVar10;
    }
    else {
      dVar10 = to_integer(pvVar8 + 1);
      if ((double)uVar2 <= dVar10) goto LAB_0012aa54;
      lVar7 = extraout_RDX;
      if (0.0 <= dVar10) goto LAB_0012a89c;
      dVar10 = (double)uVar2 - ABS(dVar10);
      uVar9 = 0;
      if (0.0 <= dVar10) {
        uVar9 = (ulong)dVar10;
      }
    }
    if (uVar2 < 0x10000) {
      for (; (uint)uVar9 < uVar2; uVar9 = (ulong)((uint)uVar9 + 1)) {
        index_string_abi_cxx11_(&is,(mjs *)(uVar9 & 0xffffffff),(uint32_t)lVar7);
        poVar6 = (object *)gc_heap_ptr_untyped::get(&o.super_gc_heap_ptr_untyped);
        local_d8._M_str = is._M_dataplus._M_p;
        local_d8._M_len = is._M_string_length;
        bVar1 = object::has_property(poVar6,&local_d8);
        if (bVar1) {
          puVar4 = (undefined8 *)gc_heap_ptr_untyped::get(&o.super_gc_heap_ptr_untyped);
          local_68 = is._M_string_length;
          local_60 = is._M_dataplus._M_p;
          (**(code **)*puVar4)((value *)&local_58,puVar4,&local_68);
          bVar1 = operator==((value *)&local_58,&search_element);
          value::~value((value *)&local_58);
          std::__cxx11::wstring::~wstring((wstring *)&is);
          lVar7 = extraout_RDX_00;
          if (bVar1) {
            local_e0 = (double)(uVar9 & 0xffffffff);
            goto LAB_0012aa62;
          }
        }
        else {
          std::__cxx11::wstring::~wstring((wstring *)&is);
          lVar7 = extraout_RDX_01;
        }
      }
      goto LAB_0012aa54;
    }
    poVar6 = (object *)gc_heap_ptr_untyped::get(&o.super_gc_heap_ptr_untyped);
    object::enumerable_property_names
              ((vector<mjs::string,_std::allocator<mjs::string>_> *)&is,poVar6);
    for (this_00 = is._M_dataplus; this_00._M_p != (pointer)is._M_string_length;
        this_00._M_p = this_00._M_p + 0x10) {
      local_58 = string::view((string *)this_00._M_p);
      uVar2 = index_value_from_string(&local_58);
      if ((uVar2 != 0xffffffff) && ((uint)uVar9 <= uVar2)) {
        puVar4 = (undefined8 *)gc_heap_ptr_untyped::get(&o.super_gc_heap_ptr_untyped);
        local_d8 = string::view((string *)this_00._M_p);
        (**(code **)*puVar4)((value *)&local_58,puVar4,&local_d8);
        bVar1 = operator==((value *)&local_58,&search_element);
        value::~value((value *)&local_58);
        if (bVar1) {
          local_e0 = (double)uVar2;
          break;
        }
      }
    }
    std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector
              ((vector<mjs::string,_std::allocator<mjs::string>_> *)&is);
    if (this_00._M_p == (pointer)is._M_string_length) goto LAB_0012aa54;
  }
LAB_0012aa62:
  value::~value(&search_element);
LAB_0012aa6c:
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&o.super_gc_heap_ptr_untyped);
  __return_storage_ptr__->type_ = number;
  (__return_storage_ptr__->field_1).n_ = local_e0;
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }